

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nanodet.cpp
# Opt level: O0

void generate_proposals(Mat *cls_pred,Mat *dis_pred,int stride,Mat *in_pad,float prob_threshold,
                       vector<Object,_std::allocator<Object>_> *objects)

{
  long in_RCX;
  int in_EDX;
  long *in_RSI;
  long *in_RDI;
  float in_XMM0_Da;
  Object obj;
  float y1;
  float x1;
  float y0;
  float x0;
  float pb_cy;
  float pb_cx;
  int l;
  float *dis_after_sm;
  float dis;
  int k_1;
  float pred_ltrb [4];
  Option opt;
  ParamDict pd;
  Layer *softmax;
  Mat bbox_pred;
  int k;
  float score;
  int label;
  float *scores;
  int idx;
  int j;
  int i;
  int reg_max_1;
  int num_class;
  int num_grid_y;
  int num_grid_x;
  int num_grid;
  char *in_stack_fffffffffffffdb8;
  Option *in_stack_fffffffffffffdc0;
  value_type *in_stack_fffffffffffffdc8;
  vector<Object,_std::allocator<Object>_> *in_stack_fffffffffffffdd0;
  ParamDict *this;
  int local_1dc;
  float local_1d0;
  int local_1cc;
  float local_1c8 [6];
  undefined1 local_1b0 [4];
  undefined4 local_1ac;
  undefined1 local_189;
  ParamDict local_170 [2];
  Layer *local_150;
  undefined1 local_148 [8];
  ParamDictPrivate *local_140;
  long local_138;
  undefined4 local_130;
  long *local_128;
  undefined4 local_120;
  int local_11c;
  undefined4 local_118;
  undefined4 local_114;
  undefined4 local_110;
  long local_108;
  int local_fc;
  float local_f8;
  int local_f4;
  long local_f0;
  int local_e8;
  int local_e4;
  int local_e0;
  int local_dc;
  int local_d8;
  int local_d4;
  int local_d0;
  int local_cc;
  float local_bc;
  int local_ac;
  long *local_a8;
  long *local_a0;
  value_type *local_98;
  int local_84;
  long *local_80;
  int local_74;
  long *local_70;
  undefined8 local_68;
  undefined8 local_60;
  _func_int **local_58;
  undefined4 local_50;
  int local_4c;
  ParamDict *local_48;
  int local_3c;
  undefined1 *local_38;
  int local_20;
  undefined4 local_1c;
  value_type *local_18;
  _func_int **local_10;
  
  local_cc = (int)in_RDI[6];
  if (*(int *)(in_RCX + 0x30) < *(int *)(in_RCX + 0x2c)) {
    local_d0 = *(int *)(in_RCX + 0x2c) / in_EDX;
    local_d4 = local_cc / local_d0;
  }
  else {
    local_d4 = *(int *)(in_RCX + 0x30) / in_EDX;
    local_d0 = local_cc / local_d4;
  }
  local_d8 = *(int *)((long)in_RDI + 0x2c);
  local_dc = *(int *)((long)in_RSI + 0x2c) / 4;
  local_bc = in_XMM0_Da;
  local_ac = in_EDX;
  local_a8 = in_RSI;
  local_a0 = in_RDI;
  for (local_e0 = 0; local_e0 < local_d4; local_e0 = local_e0 + 1) {
    for (local_e4 = 0; local_e4 < local_d0; local_e4 = local_e4 + 1) {
      local_e8 = local_e0 * local_d0 + local_e4;
      local_70 = local_a0;
      local_f0 = *local_a0 + (long)*(int *)((long)local_a0 + 0x2c) * (long)local_e8 * local_a0[2];
      local_f4 = -1;
      local_f8 = -3.4028235e+38;
      for (local_fc = 0; local_fc < local_d8; local_fc = local_fc + 1) {
        if (local_f8 < *(float *)(local_f0 + (long)local_fc * 4)) {
          local_f4 = local_fc;
          local_f8 = *(float *)(local_f0 + (long)local_fc * 4);
        }
      }
      if (local_bc <= local_f8) {
        local_80 = local_a8;
        local_58 = (_func_int **)
                   (*local_a8 + (long)*(int *)((long)local_a8 + 0x2c) * (long)local_e8 * local_a8[2]
                   );
        this = (ParamDict *)local_148;
        local_4c = local_dc;
        local_50 = 4;
        local_60 = 4;
        local_68 = 0;
        local_140 = (ParamDictPrivate *)0x0;
        local_138 = 4;
        local_130 = 1;
        local_128 = (long *)0x0;
        local_120 = 2;
        local_11c = local_dc;
        local_118 = 4;
        local_114 = 1;
        local_110 = 1;
        local_108 = (long)local_dc * 4;
        local_84 = local_e8;
        local_74 = local_e8;
        local_48 = this;
        local_148 = (undefined1  [8])local_58;
        local_150 = ncnn::create_layer(in_stack_fffffffffffffdb8);
        ncnn::ParamDict::ParamDict(this);
        ncnn::ParamDict::set(local_170,0,1);
        ncnn::ParamDict::set(local_170,1,1);
        (*local_150->_vptr_Layer[2])(local_150,local_170);
        ncnn::Option::Option(in_stack_fffffffffffffdc0);
        local_1ac = 1;
        local_189 = 0;
        (*local_150->_vptr_Layer[4])(local_150,local_1b0);
        (*local_150->_vptr_Layer[9])(local_150,local_148,local_1b0);
        (*local_150->_vptr_Layer[5])(local_150,local_1b0);
        if (local_150 != (Layer *)0x0) {
          (*local_150->_vptr_Layer[1])();
        }
        ncnn::ParamDict::~ParamDict((ParamDict *)in_stack_fffffffffffffdc0);
        for (local_1cc = 0; local_1cc < 4; local_1cc = local_1cc + 1) {
          local_1d0 = 0.0;
          local_38 = local_148;
          local_3c = local_1cc;
          in_stack_fffffffffffffdd0 =
               (vector<Object,_std::allocator<Object>_> *)
               ((long)local_148 + (long)local_11c * (long)local_1cc * local_138);
          for (local_1dc = 0; local_1dc < local_dc; local_1dc = local_1dc + 1) {
            local_1d0 = (float)local_1dc *
                        *(float *)((long)&(in_stack_fffffffffffffdd0->
                                          super__Vector_base<Object,_std::allocator<Object>_>).
                                          _M_impl.super__Vector_impl_data._M_start +
                                  (long)local_1dc * 4) + local_1d0;
          }
          local_1c8[local_1cc] = local_1d0 * (float)local_ac;
        }
        Object::Object((Object *)0x163a2c);
        std::vector<Object,_std::allocator<Object>_>::push_back
                  (in_stack_fffffffffffffdd0,in_stack_fffffffffffffdc8);
        in_stack_fffffffffffffdc8 = (value_type *)local_148;
        local_98 = in_stack_fffffffffffffdc8;
        local_18 = in_stack_fffffffffffffdc8;
        if (local_140 != (ParamDictPrivate *)0x0) {
          local_1c = 0xffffffff;
          LOCK();
          local_20 = local_140->params[0].type;
          local_140->params[0].type = local_140->params[0].type + -1;
          UNLOCK();
          if (local_20 == 1) {
            if (local_128 == (long *)0x0) {
              local_10 = (_func_int **)local_148;
              if (local_148 != (undefined1  [8])0x0) {
                free((void *)local_148);
              }
            }
            else {
              (**(code **)(*local_128 + 0x18))(local_128,local_148);
            }
          }
        }
        (in_stack_fffffffffffffdc8->rect).x = 0.0;
        (in_stack_fffffffffffffdc8->rect).y = 0.0;
        in_stack_fffffffffffffdc8->label = 0;
        in_stack_fffffffffffffdc8->prob = 0.0;
        in_stack_fffffffffffffdc8[1].rect.x = 0.0;
        in_stack_fffffffffffffdc8[1].label = 0;
        in_stack_fffffffffffffdc8[1].prob = 0.0;
        in_stack_fffffffffffffdc8[2].rect.x = 0.0;
        in_stack_fffffffffffffdc8[2].rect.y = 0.0;
        in_stack_fffffffffffffdc8[2].rect.width = 0.0;
        in_stack_fffffffffffffdc8[2].label = 0;
        in_stack_fffffffffffffdc8[2].prob = 0.0;
        (in_stack_fffffffffffffdc8->rect).width = 0.0;
        (in_stack_fffffffffffffdc8->rect).height = 0.0;
      }
    }
  }
  return;
}

Assistant:

static void generate_proposals(const ncnn::Mat& cls_pred, const ncnn::Mat& dis_pred, int stride, const ncnn::Mat& in_pad, float prob_threshold, std::vector<Object>& objects)
{
    const int num_grid = cls_pred.h;

    int num_grid_x;
    int num_grid_y;
    if (in_pad.w > in_pad.h)
    {
        num_grid_x = in_pad.w / stride;
        num_grid_y = num_grid / num_grid_x;
    }
    else
    {
        num_grid_y = in_pad.h / stride;
        num_grid_x = num_grid / num_grid_y;
    }

    const int num_class = cls_pred.w;
    const int reg_max_1 = dis_pred.w / 4;

    for (int i = 0; i < num_grid_y; i++)
    {
        for (int j = 0; j < num_grid_x; j++)
        {
            const int idx = i * num_grid_x + j;

            const float* scores = cls_pred.row(idx);

            // find label with max score
            int label = -1;
            float score = -FLT_MAX;
            for (int k = 0; k < num_class; k++)
            {
                if (scores[k] > score)
                {
                    label = k;
                    score = scores[k];
                }
            }

            if (score >= prob_threshold)
            {
                ncnn::Mat bbox_pred(reg_max_1, 4, (void*)dis_pred.row(idx));
                {
                    ncnn::Layer* softmax = ncnn::create_layer("Softmax");

                    ncnn::ParamDict pd;
                    pd.set(0, 1); // axis
                    pd.set(1, 1);
                    softmax->load_param(pd);

                    ncnn::Option opt;
                    opt.num_threads = 1;
                    opt.use_packing_layout = false;

                    softmax->create_pipeline(opt);

                    softmax->forward_inplace(bbox_pred, opt);

                    softmax->destroy_pipeline(opt);

                    delete softmax;
                }

                float pred_ltrb[4];
                for (int k = 0; k < 4; k++)
                {
                    float dis = 0.f;
                    const float* dis_after_sm = bbox_pred.row(k);
                    for (int l = 0; l < reg_max_1; l++)
                    {
                        dis += l * dis_after_sm[l];
                    }

                    pred_ltrb[k] = dis * stride;
                }

                float pb_cx = (j + 0.5f) * stride;
                float pb_cy = (i + 0.5f) * stride;

                float x0 = pb_cx - pred_ltrb[0];
                float y0 = pb_cy - pred_ltrb[1];
                float x1 = pb_cx + pred_ltrb[2];
                float y1 = pb_cy + pred_ltrb[3];

                Object obj;
                obj.rect.x = x0;
                obj.rect.y = y0;
                obj.rect.width = x1 - x0;
                obj.rect.height = y1 - y0;
                obj.label = label;
                obj.prob = score;

                objects.push_back(obj);
            }
        }
    }
}